

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annotated_binary_text_gen.cpp
# Opt level: O3

string * flatbuffers::anon_unknown_7::ToValueString<unsigned_short>
                   (string *__return_storage_ptr__,BinaryRegion *region,uint8_t *binary)

{
  uint __val;
  string *psVar1;
  ulong uVar2;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  ulong uVar3;
  byte *pbVar4;
  uint __len;
  string __str;
  string local_60;
  uint local_3c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  
  local_38 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_38;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  uVar2 = (ulong)*(ushort *)(binary + region->offset);
  local_3c = (uint)*(ushort *)(binary + region->offset);
  if (region->length != 0) {
    pbVar4 = binary + region->length + region->offset;
    uVar3 = 0;
    do {
      pbVar4 = pbVar4 + -1;
      ToHex_abi_cxx11_(&local_60,(flatbuffers *)(ulong)*pbVar4,(uint8_t)uVar2);
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_60._M_dataplus._M_p);
      uVar2 = extraout_RDX;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
        uVar2 = extraout_RDX_00;
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 < region->length);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  __val = local_3c;
  __len = 1;
  if (((9 < (ushort)local_3c) && (__len = 2, 99 < (ushort)local_3c)) && (__len = 3, 999 < local_3c))
  {
    __len = 5 - (local_3c < 10000);
  }
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_60,(char)__len);
  std::__detail::__to_chars_10_impl<unsigned_int>(local_60._M_dataplus._M_p,__len,__val);
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_60._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  psVar1 = (string *)std::__cxx11::string::append((char *)__return_storage_ptr__);
  return psVar1;
}

Assistant:

std::string ToValueString(const BinaryRegion &region, const uint8_t *binary) {
  std::string s;
  s += "0x";
  const T val = ReadScalar<T>(binary + region.offset);
  const uint64_t start_index = region.offset + region.length - 1;
  for (uint64_t i = 0; i < region.length; ++i) {
    s += ToHex(binary[start_index - i]);
  }
  s += " (";
  s += ToString(val);
  s += ")";
  return s;
}